

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O0

RateAdaptiveCode<unsigned_int> * __thiscall
LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
          (RateAdaptiveCode<unsigned_int> *__return_storage_ptr__,CodeSimulationHelpers *this,
          string *file_path,string *rate_adaption_file_path)

{
  bool bVar1;
  runtime_error *this_00;
  path local_100;
  path local_d8;
  undefined4 local_ac;
  path local_a8;
  path local_70;
  undefined1 local_48 [8];
  path filePath;
  string *rate_adaption_file_path_local;
  string *file_path_local;
  
  filePath._32_8_ = file_path;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,auto_format);
  std::filesystem::__cxx11::path::extension(&local_70,(path *)local_48);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_a8,(char (*) [8])".cscmat",auto_format);
  bVar1 = std::filesystem::__cxx11::operator==(&local_70,&local_a8);
  std::filesystem::__cxx11::path::~path(&local_a8);
  std::filesystem::__cxx11::path::~path(&local_70);
  if (bVar1) {
    load_ldpc_from_cscmat<bool,unsigned_int>
              (__return_storage_ptr__,this,(string *)filePath._32_8_,rate_adaption_file_path);
  }
  else {
    std::filesystem::__cxx11::path::extension(&local_d8,(path *)local_48);
    std::filesystem::__cxx11::path::path<char[6],std::filesystem::__cxx11::path>
              (&local_100,(char (*) [6])0x1424b4,auto_format);
    bVar1 = std::filesystem::__cxx11::operator==(&local_d8,&local_100);
    std::filesystem::__cxx11::path::~path(&local_100);
    std::filesystem::__cxx11::path::~path(&local_d8);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Expected file with extension .cscmat or .json");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    load_ldpc_from_json<bool,unsigned_int,unsigned_int>
              (__return_storage_ptr__,this,(string *)filePath._32_8_,rate_adaption_file_path);
  }
  local_ac = 1;
  std::filesystem::__cxx11::path::~path((path *)local_48);
  return __return_storage_ptr__;
}

Assistant:

LDPC4QKD::RateAdaptiveCode<idx_t> load_ldpc(
            const std::string &file_path, const std::string &rate_adaption_file_path=""
    ) {
        std::filesystem::path filePath = file_path;
        if (filePath.extension() == ".cscmat") {
            return load_ldpc_from_cscmat(file_path, rate_adaption_file_path);
        } else if (filePath.extension() == ".json") {
            return load_ldpc_from_json(file_path, rate_adaption_file_path);
        } else {
            throw std::runtime_error("Expected file with extension .cscmat or .json");
        }
    }